

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_coding.h
# Opt level: O2

uint32_t half_to_uint(uint16_t hv)

{
  float fVar1;
  
  if ((short)hv < 0) {
    return 0;
  }
  if ((~hv & 0x7c00) == 0) {
    return -(uint)((hv & 0x3ff) == 0);
  }
  fVar1 = half_to_float(hv);
  return (uint32_t)(long)fVar1;
}

Assistant:

static inline uint32_t
half_to_uint (uint16_t hv)
{
    /* replicating logic from imfmisc if negative or nan, return 0, if
     * inf, return uint32 max otherwise convert to float and cast to
     * uint */
    if (hv & 0x8000) return 0;
    if ((hv & 0x7c00) == 0x7c00)
    {
        if ((hv & 0x3ff) != 0) return 0;
        return UINT32_MAX;
    }
    return (uint32_t) (half_to_float (hv));
}